

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O3

QString * __thiscall
QMimeBinaryProvider::genericIcon
          (QString *__return_storage_ptr__,QMimeBinaryProvider *this,QString *name)

{
  QString *pQVar1;
  QString *this_00;
  undefined1 *puVar2;
  storage_type *psVar3;
  QMimeBinaryProvider *this_01;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QLatin1StringView QVar4;
  QArrayData *local_58;
  QMimeDatabasePrivate *pQStack_50;
  Data *local_48;
  Data *local_38;
  QMimeProviderBase *pQStack_30;
  _Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false> local_28;
  Data *local_20;
  
  this_01 = (QMimeBinaryProvider *)&stack0xffffffffffffffa8;
  puVar2 = (undefined1 *)&stack0xffffffffffffffa8;
  local_20 = *(Data **)(in_FS_OFFSET + 0x28);
  local_48 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQStack_50 = (QMimeDatabasePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLatin1_helper((QByteArray *)&stack0xffffffffffffffa8,name);
  QVar4 = iconForMime(this_01,(this->m_cacheFile)._M_t.
                              super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                              .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>.
                              _M_head_impl,0x24,(QByteArray *)&stack0xffffffffffffffa8);
  ba.m_size = QVar4.m_data;
  pQVar1 = (QString *)QVar4.m_size;
  psVar3 = (storage_type *)CONCAT71((int7)((ulong)puVar2 >> 8),-1 < (long)pQVar1);
  this_00 = (QString *)0x0;
  if (0 < (long)pQVar1) {
    this_00 = pQVar1;
  }
  if (ba.m_size == (char *)0x0) {
    this_00 = (QString *)0x0;
  }
  if (ba.m_size != (char *)0x0 && -1 >= (long)pQVar1) {
    this_00 = (QString *)strlen(ba.m_size);
  }
  ba.m_data = psVar3;
  QString::fromLatin1((QString *)&stack0xffffffffffffffc8,this_00,ba);
  (__return_storage_ptr__->d).d = local_38;
  (__return_storage_ptr__->d).ptr = (char16_t *)pQStack_30;
  (__return_storage_ptr__->d).size = (qsizetype)local_28._M_head_impl;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,1,0x10);
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMimeBinaryProvider::genericIcon(const QString &name)
{
    const QByteArray inputMime = name.toLatin1();
    return iconForMime(m_cacheFile.get(), PosGenericIconsListOffset, inputMime);
}